

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-error.c
# Opt level: O1

void test_bson_error_basic(void)

{
  TestSuite *suite;
  undefined1 auVar1 [16];
  bson_error_t error;
  TestSuite local_208 [10];
  
  suite = local_208;
  bson_set_error(local_208,0x7b,0x1c8,"%s %u","localhost",0x6989);
  auVar1[0] = -((char)local_208[0].name == 'l');
  auVar1[1] = -(local_208[0].name._1_1_ == 'o');
  auVar1[2] = -(local_208[0].name._2_1_ == 'c');
  auVar1[3] = -(local_208[0].name._3_1_ == 'a');
  auVar1[4] = -(local_208[0].name._4_1_ == 'l');
  auVar1[5] = -(local_208[0].name._5_1_ == 'h');
  auVar1[6] = -(local_208[0].name._6_1_ == 'o');
  auVar1[7] = -(local_208[0].name._7_1_ == 's');
  auVar1[8] = -((char)local_208[0].testname == 't');
  auVar1[9] = -(local_208[0].testname._1_1_ == ' ');
  auVar1[10] = -(local_208[0].testname._2_1_ == '2');
  auVar1[0xb] = -(local_208[0].testname._3_1_ == '7');
  auVar1[0xc] = -(local_208[0].testname._4_1_ == '0');
  auVar1[0xd] = -(local_208[0].testname._5_1_ == '1');
  auVar1[0xe] = -(local_208[0].testname._6_1_ == '7');
  auVar1[0xf] = -(local_208[0].testname._7_1_ == '\0');
  if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe | (ushort)(auVar1[0xf] >> 7) << 0xf) ==
      0xffff) {
    if ((int)local_208[0].prgname == 0x7b) {
      if (local_208[0].prgname._4_4_ == 0x1c8) {
        return;
      }
      goto LAB_00129021;
    }
  }
  else {
    test_bson_error_basic_cold_1();
  }
  test_bson_error_basic_cold_2();
LAB_00129021:
  test_bson_error_basic_cold_3();
  TestSuite_Add(suite,"/bson/iso8601/utc",test_bson_iso8601_utc);
  TestSuite_Add(suite,"/bson/iso8601/local",test_bson_iso8601_local);
  TestSuite_Add(suite,"/bson/iso8601/invalid",test_bson_iso8601_invalid);
  TestSuite_Add(suite,"/bson/iso8601/leap_year",test_bson_iso8601_leap_year);
  return;
}

Assistant:

static void
test_bson_error_basic (void)
{
   bson_error_t error;

   bson_set_error (&error, 123, 456, "%s %u", "localhost", 27017);
   BSON_ASSERT (!strcmp (error.message, "localhost 27017"));
   BSON_ASSERT_CMPINT (error.domain, ==, 123);
   BSON_ASSERT_CMPINT (error.code, ==, 456);
}